

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::PopulateIncludeDirectoriesInterface
          (cmExportFileGenerator *this,cmTargetExport *tei,PreprocessContext preprocessRule,
          ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  cmListFileBacktrace *this_00;
  cmGeneratorTarget *this_01;
  char *target_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  char *pcVar3;
  pointer pcVar4;
  cmLocalGenerator *pcVar5;
  string *psVar6;
  ostream *poVar7;
  ulong uVar8;
  mapped_type *this_02;
  char *local_480;
  allocator<char> local_3c1;
  key_type local_3c0;
  allocator<char> local_399;
  string local_398;
  undefined1 local_378 [8];
  string prepro;
  char *sep;
  undefined1 local_328 [8];
  string includes;
  key_type local_300;
  undefined4 local_2dc;
  string local_2d8;
  undefined1 local_2b8 [8];
  ostringstream e;
  cmLocalGenerator *lg;
  allocator<char> local_111;
  string local_110;
  undefined1 local_f0 [8];
  string exportDirs;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string dirs;
  undefined1 local_90 [8];
  cmGeneratorExpression ge;
  allocator<char> local_69;
  string local_68;
  char *local_48;
  char *input;
  char *propName;
  cmGeneratorTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *missingTargets_local;
  ImportPropertyMap *properties_local;
  cmTargetExport *pcStack_18;
  PreprocessContext preprocessRule_local;
  cmTargetExport *tei_local;
  cmExportFileGenerator *this_local;
  
  this_01 = tei->Target;
  propName = (char *)this_01;
  target = (cmGeneratorTarget *)missingTargets;
  missingTargets_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)properties;
  properties_local._4_4_ = preprocessRule;
  pcStack_18 = tei;
  tei_local = (cmTargetExport *)this;
  if (preprocessRule != InstallInterface) {
    __assert_fail("preprocessRule == cmGeneratorExpression::InstallInterface",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmExportFileGenerator.cxx"
                  ,0x172,
                  "void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(cmTargetExport *, cmGeneratorExpression::PreprocessContext, ImportPropertyMap &, std::vector<std::string> &)"
                 );
  }
  input = "INTERFACE_INCLUDE_DIRECTORIES";
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"INTERFACE_INCLUDE_DIRECTORIES",&local_69);
  pcVar3 = cmGeneratorTarget::GetProperty(this_01,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  dirs.field_2._8_8_ = 0;
  this_00 = (cmListFileBacktrace *)((long)&dirs.field_2 + 8);
  local_48 = pcVar3;
  cmListFileBacktrace::cmListFileBacktrace(this_00);
  cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)local_90,this_00);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)((long)&dirs.field_2 + 8));
  cmGeneratorExpression::Preprocess
            ((string *)&cge,&pcStack_18->InterfaceIncludeDirectories,properties_local._4_4_,true);
  (*this->_vptr_cmExportFileGenerator[0x11])(this,&cge);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)((long)&exportDirs.field_2 + 8),(string *)local_90);
  pcVar4 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)((long)&exportDirs.field_2 + 8));
  pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)propName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  pcVar3 = propName;
  std::__cxx11::string::string((string *)&lg);
  psVar6 = cmCompiledGeneratorExpression::Evaluate
                     (pcVar4,pcVar5,&local_110,false,(cmGeneratorTarget *)pcVar3,
                      (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,(string *)&lg)
  ;
  std::__cxx11::string::string((string *)local_f0,(string *)psVar6);
  std::__cxx11::string::~string((string *)&lg);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pcVar4 = std::
           unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
           ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                         *)((long)&exportDirs.field_2 + 8));
  bVar2 = cmCompiledGeneratorExpression::GetHadContextSensitiveCondition(pcVar4);
  if (bVar2) {
    pcVar5 = cmGeneratorTarget::GetLocalGenerator((cmGeneratorTarget *)propName);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b8);
    poVar7 = std::operator<<((ostream *)local_2b8,"Target \"");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)propName);
    poVar7 = std::operator<<(poVar7,(string *)psVar6);
    std::operator<<(poVar7,
                    "\" is installed with INCLUDES DESTINATION set to a context sensitive path.  Paths which depend on the configuration, policy values or the link interface are not supported.  Consider using target_include_directories instead."
                   );
    std::__cxx11::ostringstream::str();
    cmLocalGenerator::IssueMessage(pcVar5,FATAL_ERROR,&local_2d8);
    std::__cxx11::string::~string((string *)&local_2d8);
    local_2dc = 1;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b8);
    goto LAB_00419fb7;
  }
  if ((local_48 == (char *)0x0) && (uVar8 = std::__cxx11::string::empty(), (uVar8 & 1) != 0)) {
    local_2dc = 1;
    goto LAB_00419fb7;
  }
  if (((local_48 != (char *)0x0) && (*local_48 == '\0')) &&
     (uVar8 = std::__cxx11::string::empty(), pvVar1 = missingTargets_local, pcVar3 = input,
     (uVar8 & 1) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,pcVar3,(allocator<char> *)(includes.field_2._M_local_buf + 0xf))
    ;
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)pvVar1,&local_300);
    std::__cxx11::string::clear();
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
    local_2dc = 1;
    goto LAB_00419fb7;
  }
  prefixItems((string *)local_f0);
  if (local_48 == (char *)0x0) {
    local_480 = "";
  }
  else {
    local_480 = local_48;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_328,local_480,(allocator<char> *)((long)&sep + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&sep + 7));
  pcVar3 = "";
  if (local_48 != (char *)0x0) {
    pcVar3 = ";";
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&prepro.field_2 + 8),pcVar3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
  std::__cxx11::string::operator+=((string *)local_328,(string *)(prepro.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(prepro.field_2._M_local_buf + 8));
  cmGeneratorExpression::Preprocess
            ((string *)local_378,(string *)local_328,properties_local._4_4_,true);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    ResolveTargetsInGeneratorExpressions
              (this,(string *)local_378,(cmGeneratorTarget *)propName,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)target,NoReplaceFreeTargets);
    target_00 = propName;
    pcVar3 = input;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,pcVar3,&local_399);
    bVar2 = checkInterfaceDirs((string *)local_378,(cmGeneratorTarget *)target_00,&local_398);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
    pvVar1 = missingTargets_local;
    pcVar3 = input;
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,pcVar3,&local_3c1);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)pvVar1,&local_3c0);
      std::__cxx11::string::operator=((string *)this_02,(string *)local_378);
      std::__cxx11::string::~string((string *)&local_3c0);
      std::allocator<char>::~allocator(&local_3c1);
      goto LAB_00419f95;
    }
    local_2dc = 1;
  }
  else {
LAB_00419f95:
    local_2dc = 0;
  }
  std::__cxx11::string::~string((string *)local_378);
  std::__cxx11::string::~string((string *)local_328);
LAB_00419fb7:
  std::__cxx11::string::~string((string *)local_f0);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)((long)&exportDirs.field_2 + 8));
  std::__cxx11::string::~string((string *)&cge);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_90);
  return;
}

Assistant:

void cmExportFileGenerator::PopulateIncludeDirectoriesInterface(
  cmTargetExport* tei, cmGeneratorExpression::PreprocessContext preprocessRule,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  cmGeneratorTarget* target = tei->Target;
  assert(preprocessRule == cmGeneratorExpression::InstallInterface);

  const char* propName = "INTERFACE_INCLUDE_DIRECTORIES";
  const char* input = target->GetProperty(propName);

  cmGeneratorExpression ge;

  std::string dirs = cmGeneratorExpression::Preprocess(
    tei->InterfaceIncludeDirectories, preprocessRule, true);
  this->ReplaceInstallPrefix(dirs);
  std::unique_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(dirs);
  std::string exportDirs =
    cge->Evaluate(target->GetLocalGenerator(), "", false, target);

  if (cge->GetHadContextSensitiveCondition()) {
    cmLocalGenerator* lg = target->GetLocalGenerator();
    std::ostringstream e;
    e << "Target \"" << target->GetName()
      << "\" is installed with "
         "INCLUDES DESTINATION set to a context sensitive path.  Paths which "
         "depend on the configuration, policy values or the link interface "
         "are "
         "not supported.  Consider using target_include_directories instead.";
    lg->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (!input && exportDirs.empty()) {
    return;
  }
  if ((input && !*input) && exportDirs.empty()) {
    // Set to empty
    properties[propName].clear();
    return;
  }

  prefixItems(exportDirs);

  std::string includes = (input ? input : "");
  const char* sep = input ? ";" : "";
  includes += sep + exportDirs;
  std::string prepro =
    cmGeneratorExpression::Preprocess(includes, preprocessRule, true);
  if (!prepro.empty()) {
    this->ResolveTargetsInGeneratorExpressions(prepro, target, missingTargets);

    if (!checkInterfaceDirs(prepro, target, propName)) {
      return;
    }
    properties[propName] = prepro;
  }
}